

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_union_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_union_type_f *ptf,
               flatcc_json_printer_union_f *pf)

{
  uint8_t uVar1;
  uint uVar2;
  char *pcVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  void *pvVar9;
  flatcc_json_printer_union_descriptor_t ud;
  char type_name [105];
  flatcc_json_printer_union_descriptor_t local_c8;
  char *local_b8;
  uint *local_b0;
  char local_a8 [4];
  undefined1 auStack_a4 [116];
  
  puVar4 = (uint *)get_field_ptr(td,id + -1);
  puVar5 = (uint *)get_field_ptr(td,id);
  local_c8.ttl = td->ttl;
  if (len < 0x65) {
    local_b8 = name;
    memcpy(local_a8,name,len);
    builtin_strncpy(local_a8 + len,"_typ",4);
    auStack_a4[len] = 0x65;
    if (puVar4 != (uint *)0x0 && puVar5 != (uint *)0x0) {
      local_b0 = puVar4;
      flatcc_json_printer_utype_enum_vector_field(ctx,td,id + -1,local_a8,len + 5,ptf);
      puVar4 = local_b0;
      iVar8 = td->count;
      td->count = iVar8 + 1;
      if (iVar8 != 0) {
        pcVar3 = ctx->p;
        ctx->p = pcVar3 + 1;
        *pcVar3 = ',';
      }
      uVar6 = (ulong)*puVar5;
      uVar2 = *local_b0;
      iVar8 = *(int *)((long)puVar5 + uVar6);
      print_name(ctx,local_b8,len);
      ctx->level = ctx->level + 1;
      pcVar3 = ctx->p;
      ctx->p = pcVar3 + 1;
      *pcVar3 = '[';
      if (iVar8 == 0) {
        iVar8 = 0;
      }
      else {
        uVar1 = *(uint8_t *)((long)puVar4 + (ulong)uVar2 + 4);
        if (uVar1 == '\0') {
          pcVar3 = ctx->p;
          ctx->p = pcVar3 + 1;
          *pcVar3 = 'n';
          pcVar3 = ctx->p;
          ctx->p = pcVar3 + 1;
          *pcVar3 = 'u';
          pcVar3 = ctx->p;
          ctx->p = pcVar3 + 1;
          *pcVar3 = 'l';
          pcVar3 = ctx->p;
          ctx->p = pcVar3 + 1;
          *pcVar3 = 'l';
        }
        else {
          local_c8.member = (void *)((long)puVar5 + uVar6 + 4);
          local_c8.type = uVar1;
          (*pf)(ctx,&local_c8);
        }
        iVar8 = iVar8 + -1;
      }
      pvVar9 = (void *)((long)puVar5 + uVar6 + 8);
      for (lVar7 = 0; iVar8 != (int)lVar7; lVar7 = lVar7 + 1) {
        uVar1 = *(uint8_t *)((long)puVar4 + lVar7 + (ulong)uVar2 + 5);
        pcVar3 = ctx->p;
        ctx->p = pcVar3 + 1;
        *pcVar3 = ',';
        if (uVar1 == '\0') {
          pcVar3 = ctx->p;
          ctx->p = pcVar3 + 1;
          *pcVar3 = 'n';
          pcVar3 = ctx->p;
          ctx->p = pcVar3 + 1;
          *pcVar3 = 'u';
          pcVar3 = ctx->p;
          ctx->p = pcVar3 + 1;
          *pcVar3 = 'l';
          pcVar3 = ctx->p;
          ctx->p = pcVar3 + 1;
          *pcVar3 = 'l';
        }
        else {
          local_c8.member = pvVar9;
          local_c8.type = uVar1;
          (*pf)(ctx,&local_c8);
        }
        pvVar9 = (void *)((long)pvVar9 + 4);
      }
      if (ctx->indent != '\0') {
        pcVar3 = ctx->p;
        ctx->p = pcVar3 + 1;
        *pcVar3 = '\n';
        ctx->level = ctx->level + -1;
        print_indent(ctx);
      }
      pcVar3 = ctx->p;
      ctx->p = pcVar3 + 1;
      *pcVar3 = ']';
    }
    return;
  }
  if (ctx->error == 0) {
    ctx->error = 1;
  }
  __assert_fail("0 && \"identifier too long\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                ,0x41c,
                "void flatcc_json_printer_union_vector_field(flatcc_json_printer_t *, flatcc_json_printer_table_descriptor_t *, int, const char *, size_t, flatcc_json_printer_union_type_f *, flatcc_json_printer_union_f *)"
               );
}

Assistant:

void flatcc_json_printer_union_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_union_type_f ptf,
        flatcc_json_printer_union_f pf)
{
    const uoffset_t *pt = get_field_ptr(td, id - 1);
    const uoffset_t *p = get_field_ptr(td, id);
    utype_t *types, type;
    uoffset_t count;
    char type_name[FLATCC_JSON_PRINT_NAME_LEN_MAX + 5];
    flatcc_json_printer_union_descriptor_t ud;

    ud.ttl = td->ttl;
    if (len > FLATCC_JSON_PRINT_NAME_LEN_MAX) {
        RAISE_ERROR(bad_input);
        FLATCC_ASSERT(0 && "identifier too long");
        return;
    }
    memcpy(type_name, name, len);
    memcpy(type_name + len, "_type", 5);
    if (p && pt) {
        flatcc_json_printer_utype_enum_vector_field(ctx, td, id - 1,
                type_name, len + 5, ptf);
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        pt = read_uoffset_ptr(pt);
        count = __flatbuffers_uoffset_read_from_pe(p);
        ++p;
        ++pt;
        types = (utype_t *)pt;
        print_name(ctx, name, len);
        print_start('[');

        if (count) {
            type = __flatbuffers_utype_read_from_pe(types);
            if (type != 0) {
                ud.type = type;
                ud.member = p;
                pf(ctx, &ud);
            } else {
                print_null();
            }
            --count;
        }
        while (count--) {
            ++p;
            ++types;
            type = __flatbuffers_utype_read_from_pe(types);
            print_char(',');
            if (type != 0) {
                ud.type = type;
                ud.member = p;
                pf(ctx, &ud);
            } else {
                print_null();
            }
        }
        print_end(']');
    }
}